

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O0

wcharstring * prepare_disk_info_abi_cxx11_(wcharstring *__return_storage_ptr__,Json *json)

{
  bool bVar1;
  uint uVar2;
  runtime_error *this;
  Json *pJVar3;
  ostream *poVar4;
  char16_t *__s;
  allocator<unsigned_short> local_341;
  byte_string local_340;
  undefined1 local_320 [8];
  u16string utf16;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream s;
  ostream local_1a0 [392];
  Json *local_18;
  Json *json_local;
  
  local_18 = json;
  json_local = (Json *)__return_storage_ptr__;
  bVar1 = json11::Json::is_null(json);
  if (bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Json is null");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"trash_size",&local_1d1);
  pJVar3 = json11::Json::operator[](json,&local_1d0);
  bVar1 = json11::Json::is_null(pJVar3);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<(local_1a0,"Trash size: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"trash_size",&local_1f9);
    pJVar3 = json11::Json::operator[](json,&local_1f8);
    uVar2 = json11::Json::int_value(pJVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2 >> 0x14);
    std::operator<<(poVar4," Mb\n");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"total_space",&local_221);
  pJVar3 = json11::Json::operator[](json,&local_220);
  bVar1 = json11::Json::is_null(pJVar3);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<(local_1a0,"Total space: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"total_space",&local_249);
    pJVar3 = json11::Json::operator[](json,&local_248);
    uVar2 = json11::Json::int_value(pJVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2 >> 0x1e);
    std::operator<<(poVar4," Gb\n");
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"used_space",&local_271);
  pJVar3 = json11::Json::operator[](json,&local_270);
  bVar1 = json11::Json::is_null(pJVar3);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<(local_1a0,"Used space: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_298,"used_space",(allocator *)&convert.field_0x5f)
    ;
    pJVar3 = json11::Json::operator[](json,&local_298);
    uVar2 = json11::Json::int_value(pJVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2 >> 0x14);
    std::operator<<(poVar4," Mb\n");
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&convert.field_0x5f);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                     *)((long)&utf16.field_2 + 8));
  std::__cxx11::stringstream::str();
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes((wide_string *)local_320,
               (wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                *)((long)&utf16.field_2 + 8),&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  __s = std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::data((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_320);
  std::allocator<unsigned_short>::allocator(&local_341);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  basic_string(__return_storage_ptr__,(unsigned_short *)__s,&local_341);
  std::allocator<unsigned_short>::~allocator(&local_341);
  std::__cxx11::u16string::~u16string((u16string *)local_320);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                      *)((long)&utf16.field_2 + 8));
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

wcharstring prepare_disk_info(json11::Json json)
{
    if(json.is_null())
        throw std::runtime_error("Json is null");

    std::stringstream s;
    if(!json["trash_size"].is_null())
        s << "Trash size: " << (unsigned int) json["trash_size"].int_value() / (1024*1024) << " Mb\n";
    if(!json["total_space"].is_null())
        s << "Total space: " << (unsigned int) json["total_space"].int_value() / (1024*1024*1024) << " Gb\n";
    if(!json["used_space"].is_null())
        s << "Used space: " << (unsigned int) json["used_space"].int_value() / (1024*1024) << " Mb\n";

    std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> convert;
    std::u16string utf16 = convert.from_bytes(s.str());

    return wcharstring((WCHAR*)utf16.data());
}